

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O1

bool __thiscall draco::ObjEncoder::EncodeFaces(ObjEncoder *this)

{
  EncoderBuffer *pEVar1;
  undefined8 in_RAX;
  ulong uVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar3;
  int j;
  long lVar4;
  
  if (this->added_edges_att_ == (PointAttribute *)0x0) {
    if ((int)((ulong)((long)(this->in_mesh_->faces_).vector_.
                            super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->in_mesh_->faces_).vector_.
                           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 != 0) {
      lVar3 = 0;
      uVar2 = 0;
      do {
        EncodeFaceAttributes(this,(FaceIndex)(uint)uVar2);
        pEVar1 = this->out_buffer_;
        in_RAX = CONCAT17(0x66,(int7)in_RAX);
        if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
          std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                    ((vector<char,std::allocator<char>> *)pEVar1,
                     (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,&stack0xffffffffffffffcf,
                     &stack0xffffffffffffffd0,in_R8,in_R9,in_RAX);
        }
        lVar4 = 0;
        do {
          EncodeFaceCorner(this,(PointIndex)
                                *(uint *)((long)(((this->in_mesh_->faces_).vector_.
                                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_elems + lVar4) + lVar3));
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        pEVar1 = this->out_buffer_;
        if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
          std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                    ((vector<char,std::allocator<char>> *)pEVar1,
                     (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,"\n","");
        }
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0xc;
      } while (uVar2 < (uint)((int)((ulong)((long)(this->in_mesh_->faces_).vector_.
                                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->in_mesh_->faces_).vector_.
                                                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                             -0x55555555));
    }
  }
  else {
    EncodePolygonalFaces(this);
  }
  return true;
}

Assistant:

bool ObjEncoder::EncodeFaces() {
  if (added_edges_att_ != nullptr) {
    return EncodePolygonalFaces();
  }
  for (FaceIndex i(0); i < in_mesh_->num_faces(); ++i) {
    EncodeFaceAttributes(i);
    buffer()->Encode('f');
    for (int j = 0; j < 3; ++j) {
      if (!EncodeFaceCorner(i, j)) {
        return false;
      }
    }
    buffer()->Encode("\n", 1);
  }
  return true;
}